

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::descriptor_set_layout_is_supported
          (Impl *this,VkDescriptorSetLayoutCreateInfo *info)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  int iVar4;
  VkBool32 VVar5;
  DeviceQueryInterface *pDVar6;
  bool bVar7;
  char cVar8;
  const_iterator cVar9;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  _Var10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  VkBaseInStructure *sin_1;
  int *piVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  VkBaseInStructure *sin;
  int *piVar20;
  ulong uVar21;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_80;
  int local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint32_t local_60;
  uint local_5c;
  key_type local_58;
  uint local_38;
  uint local_34;
  
  if ((info->flags & 0xffffff0c) != 0) {
    return false;
  }
  if (this->null_device != false) {
    return true;
  }
  if ((info->flags & 1) != 0) {
    paVar2 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"VK_KHR_push_descriptor","")
    ;
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this,&local_58);
    if (cVar9.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      VVar5 = (this->features).vk14.pushDescriptor;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (VVar5 == 0) {
        return false;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58._M_dataplus._M_p != paVar2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if ((info->flags & 2) != 0) {
    paVar2 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"VK_EXT_descriptor_indexing","");
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this,&local_58);
    if (cVar9.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      VVar5 = (this->features).vk12.descriptorIndexing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (VVar5 == 0) {
        return false;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58._M_dataplus._M_p != paVar2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  local_38 = info->flags;
  if ((local_38 & 0x30) != 0) {
    if ((this->features).descriptor_buffer.descriptorBuffer == 0) {
      return false;
    }
    if (((local_38 & 1) != 0) &&
       ((this->features).descriptor_buffer.descriptorBufferPushDescriptors == 0)) {
      return false;
    }
  }
  if (((char)local_38 < '\0') &&
     ((this->features).device_generated_commands_compute_nv.deviceGeneratedCompute == 0)) {
    return false;
  }
  if (((local_38 & 0x40) != 0) &&
     ((this->features).per_stage_descriptor_set_nv.perStageDescriptorSet == 0)) {
    return false;
  }
  local_8c = 0;
  local_90 = 0;
  local_84 = 0;
  local_88 = 0;
  local_64 = 0;
  local_68 = 0;
  local_5c = 0;
  local_94 = 0;
  local_6c = 0;
  piVar15 = (int *)info->pNext;
  piVar20 = piVar15;
  if (piVar15 == (int *)0x0) {
    piVar20 = (int *)0x0;
  }
  else {
    do {
      if (*piVar20 == 0x3b9d3ee8) goto LAB_0010e901;
      piVar1 = piVar20 + 2;
      piVar20 = *(int **)piVar1;
    } while (*(int **)piVar1 != (int *)0x0);
    piVar20 = (int *)0x0;
LAB_0010e901:
    do {
      if (*piVar15 == 0x3ba0251a) goto LAB_0010e91a;
      piVar15 = *(int **)(piVar15 + 2);
    } while (piVar15 != (int *)0x0);
  }
  piVar15 = (int *)0x0;
LAB_0010e91a:
  local_60 = info->bindingCount;
  if (local_60 == 0) {
    uVar12 = 0;
    local_70 = 0;
  }
  else {
    _Var10._M_cur = (__node_type *)info->pBindings;
    uVar21 = 0;
    local_70 = 0;
    uVar12 = 0;
    do {
      local_34 = uVar12;
      local_80._M_cur = _Var10._M_cur;
      bVar7 = shader_stage_mask_is_supported
                        (this,*(VkShaderStageFlags *)
                               ((long)&((_Var10._M_cur)->
                                       super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                       ).
                                       super__Hash_node_value_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._M_storage._M_storage + uVar21 * 0x18 + 4));
      _Var10._M_cur = local_80._M_cur;
      if (!bVar7) {
        return false;
      }
      if (piVar20 == (int *)0x0) {
        bVar11 = 0;
      }
      else {
        uVar12 = *(uint *)(*(long *)(piVar20 + 6) + uVar21 * 4);
        if (0xf < uVar12) {
          return false;
        }
        if (uVar21 < (uint)piVar20[4]) {
          bVar11 = (byte)uVar12 & 1;
        }
        else {
          bVar11 = 0;
        }
      }
      iVar19 = *(int *)((long)&(&(local_80._M_cur)->super__Hash_node_base)[uVar21 * 3]._M_nxt + 4);
      if (0x3b9d13ef < iVar19) {
        if (1 < iVar19 + 0xc45e7f40U) {
          if (iVar19 != 0x3b9d13f0) {
            if (iVar19 != 0x3ba02518) {
              return false;
            }
            if (piVar15 == (int *)0x0) {
              return false;
            }
            if ((this->features).mutable_descriptor_type.mutableDescriptorType == 0) {
              return false;
            }
            iVar19 = 0;
            if ((uint)piVar15[4] <= uVar21) {
              return false;
            }
            uVar13 = (ulong)*(uint *)(*(long *)(piVar15 + 6) + uVar21 * 0x10);
            if (uVar13 == 0) {
              iVar16 = 0;
              local_74 = 0;
              iVar18 = 0;
            }
            else {
              uVar17 = 0;
              iVar18 = 0;
              local_74 = 0;
              iVar16 = 0;
              iVar19 = 0;
              do {
                switch(*(undefined4 *)
                        (*(long *)(*(long *)(piVar15 + 6) + uVar21 * 0x10 + 8) + uVar17 * 4)) {
                case 0:
                  local_70 = 1;
                  iVar19 = 1;
                  goto LAB_0010eb4e;
                default:
                  return false;
                case 2:
                  iVar19 = 1;
                  VVar5 = (this->features).descriptor_indexing.
                          descriptorBindingSampledImageUpdateAfterBind;
                  goto joined_r0x0010eb11;
                case 3:
                  iVar16 = 1;
                  VVar5 = (this->features).descriptor_indexing.
                          descriptorBindingStorageImageUpdateAfterBind;
joined_r0x0010eb11:
                  if ((VVar5 == 0 & bVar11) != 0) {
                    return false;
                  }
                  goto LAB_0010eb4e;
                case 4:
                  iVar19 = 1;
                  VVar5 = (this->features).descriptor_indexing.
                          descriptorBindingUniformTexelBufferUpdateAfterBind;
                  break;
                case 5:
                  iVar16 = 1;
                  VVar5 = (this->features).descriptor_indexing.
                          descriptorBindingStorageTexelBufferUpdateAfterBind;
                  break;
                case 6:
                  iVar18 = 1;
                  VVar5 = (this->features).descriptor_indexing.
                          descriptorBindingUniformBufferUpdateAfterBind;
                  break;
                case 7:
                  local_74 = 1;
                  VVar5 = (this->features).descriptor_indexing.
                          descriptorBindingStorageBufferUpdateAfterBind;
                }
                if ((VVar5 == 0 & bVar11) != 0) {
                  return false;
                }
LAB_0010eb4e:
                uVar17 = uVar17 + 1;
              } while (uVar13 != uVar17);
            }
            iVar4 = *(int *)((long)&((local_80._M_cur)->
                                    super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    ).
                                    super__Hash_node_value_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_storage._M_storage + uVar21 * 0x18);
            local_8c = local_8c + iVar19 * iVar4;
            local_90 = local_90 + iVar16 * iVar4;
            local_88 = local_88 + iVar18 * iVar4;
            local_84 = local_84 + local_74 * iVar4;
            goto LAB_0010eccd;
          }
          if ((bVar11 & (this->features).acceleration_structure.
                        descriptorBindingAccelerationStructureUpdateAfterBind == 0) != 0) {
            return false;
          }
          puVar14 = &local_6c;
          if ((this->features).acceleration_structure.accelerationStructure == 0) {
            return false;
          }
          goto LAB_0010ecc1;
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"VK_QCOM_image_processing","");
        _Var10._M_cur =
             (__node_type *)
             std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)this,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          local_80._M_cur = _Var10._M_cur;
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          _Var10._M_cur = local_80._M_cur;
        }
        if (_Var10._M_cur == (__node_type *)0x0) {
          return false;
        }
        _Var10._M_cur = (__node_type *)info->pBindings;
        local_60 = info->bindingCount;
        goto LAB_0010eccd;
      }
      switch(iVar19) {
      case 0:
        bVar7 = (this->features).descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind ==
                0;
        puVar14 = &local_68;
        break;
      case 1:
      case 2:
        VVar5 = (this->features).descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind;
        goto LAB_0010ec48;
      case 3:
        VVar5 = (this->features).descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind;
        goto LAB_0010ec8b;
      case 4:
        VVar5 = (this->features).descriptor_indexing.
                descriptorBindingUniformTexelBufferUpdateAfterBind;
LAB_0010ec48:
        bVar7 = VVar5 == 0;
        puVar14 = &local_8c;
        break;
      case 5:
        VVar5 = (this->features).descriptor_indexing.
                descriptorBindingStorageTexelBufferUpdateAfterBind;
LAB_0010ec8b:
        bVar7 = VVar5 == 0;
        puVar14 = &local_90;
        break;
      case 6:
        bVar7 = (this->features).descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind
                == 0;
        puVar14 = &local_88;
        break;
      case 7:
        bVar7 = (this->features).descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind
                == 0;
        puVar14 = &local_84;
        break;
      case 8:
        puVar14 = &local_5c;
        goto LAB_0010ecb9;
      case 9:
        puVar14 = &local_94;
        goto LAB_0010ecb9;
      case 10:
        puVar14 = &local_64;
LAB_0010ecb9:
        if (bVar11 != 0) {
          return false;
        }
        goto LAB_0010ecc1;
      default:
        if (iVar19 != 0x3b9ce510) {
          return false;
        }
        if ((this->features).inline_uniform_block.inlineUniformBlock == 0) {
          return false;
        }
        if ((this->props).inline_uniform_block.maxInlineUniformBlockSize <
            *(uint *)((long)&((local_80._M_cur)->
                             super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ).
                             super__Hash_node_value_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_storage._M_storage + uVar21 * 0x18)) {
          return false;
        }
        if ((bVar11 & (this->features).inline_uniform_block.
                      descriptorBindingInlineUniformBlockUpdateAfterBind == 0) != 0) {
          return false;
        }
        goto LAB_0010eccd;
      }
      if ((bVar11 & bVar7) != 0) {
        return false;
      }
LAB_0010ecc1:
      *puVar14 = *puVar14 +
                 *(int *)((long)&((local_80._M_cur)->
                                 super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 ).
                                 super__Hash_node_value_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_storage._M_storage + uVar21 * 0x18);
LAB_0010eccd:
      uVar12 = local_34 +
               *(int *)((long)&((_Var10._M_cur)->
                               super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               ).
                               super__Hash_node_value_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_storage._M_storage + uVar21 * 0x18);
      uVar21 = uVar21 + 1;
    } while (uVar21 < local_60);
  }
  VVar5 = (this->features).maintenance7.maintenance7;
  if ((local_38 & 2) == 0) {
    if (VVar5 == 0) {
      if ((this->props2).properties.limits.maxDescriptorSetUniformBuffersDynamic < local_5c) {
        return false;
      }
      if ((this->props2).properties.limits.maxDescriptorSetStorageBuffersDynamic < local_94) {
        return false;
      }
    }
    else {
      if ((this->props).maintenance7.maxDescriptorSetTotalUniformBuffersDynamic < local_5c) {
        return false;
      }
      if ((this->props).maintenance7.maxDescriptorSetTotalStorageBuffersDynamic < local_94) {
        return false;
      }
      if ((this->props).maintenance7.maxDescriptorSetTotalBuffersDynamic < local_94 + local_5c) {
        return false;
      }
    }
    if ((this->props2).properties.limits.maxDescriptorSetUniformBuffers < local_88) {
      return false;
    }
    if ((this->props2).properties.limits.maxDescriptorSetStorageBuffers < local_84) {
      return false;
    }
    if ((this->props2).properties.limits.maxDescriptorSetSampledImages < local_8c) {
      return false;
    }
    if ((this->props2).properties.limits.maxDescriptorSetStorageImages < local_90) {
      return false;
    }
    if ((this->props2).properties.limits.maxDescriptorSetSamplers < local_68) {
      return false;
    }
    if ((this->props2).properties.limits.maxDescriptorSetInputAttachments < local_64) {
      return false;
    }
    uVar3 = (this->props).acceleration_structure.maxDescriptorSetAccelerationStructures;
  }
  else {
    if (VVar5 == 0) {
      if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic <
          local_5c) {
        return false;
      }
      if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic <
          local_94) {
        return false;
      }
    }
    else {
      if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic <
          local_5c) {
        return false;
      }
      if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic <
          local_94) {
        return false;
      }
      if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic <
          local_94 + local_5c) {
        return false;
      }
    }
    if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers < local_88)
    {
      return false;
    }
    uVar3 = (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers;
    if (uVar3 < local_84) {
      return false;
    }
    if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages < local_8c) {
      return false;
    }
    if (uVar3 < local_90) {
      return false;
    }
    if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers < local_68) {
      return false;
    }
    if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments < local_64
       ) {
      return false;
    }
    uVar3 = (this->props).acceleration_structure.
            maxDescriptorSetUpdateAfterBindAccelerationStructures;
  }
  if (((local_6c <= uVar3) &&
      (((info->flags & 1) == 0 || (uVar12 <= (this->props).push_descriptor.maxPushDescriptors)))) &&
     (((local_70 & 1) == 0 ||
      ((pDVar6 = this->query, pDVar6 == (DeviceQueryInterface *)0x0 ||
       (cVar8 = (**(code **)(*(long *)pDVar6 + 0x18))(pDVar6,info), cVar8 != '\0')))))) {
    bVar7 = pnext_chain_is_supported(this,info->pNext);
    return bVar7;
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::descriptor_set_layout_is_supported(const VkDescriptorSetLayoutCreateInfo *info) const
{
	bool must_check_set_layout_before_accept = false;

	// Only allow flags we recognize and validate.
	constexpr VkDescriptorSetLayoutCreateFlags supported_flags =
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_EMBEDDED_IMMUTABLE_SAMPLERS_BIT_EXT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_INDIRECT_BINDABLE_BIT_NV |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_PER_STAGE_BIT_NV;

	if ((info->flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR) != 0)
	{
		if (enabled_extensions.count(VK_KHR_PUSH_DESCRIPTOR_EXTENSION_NAME) == 0 && features.vk14.pushDescriptor == 0)
			return false;
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT) != 0)
	{
		// There doesn't seem to be a specific feature bit for this flag, key it on extension being enabled.
		// For specific descriptor types, we check the individual features.
		if (enabled_extensions.count(VK_EXT_DESCRIPTOR_INDEXING_EXTENSION_NAME) == 0 && !features.vk12.descriptorIndexing)
			return false;
	}

	if ((info->flags & (VK_DESCRIPTOR_SET_LAYOUT_CREATE_EMBEDDED_IMMUTABLE_SAMPLERS_BIT_EXT |
	                    VK_DESCRIPTOR_SET_LAYOUT_CREATE_DESCRIPTOR_BUFFER_BIT_EXT)) != 0)
	{
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

		if (info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR)
		{
			if (!features.descriptor_buffer.descriptorBufferPushDescriptors)
				return false;
		}
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_INDIRECT_BINDABLE_BIT_NV) != 0 &&
	    features.device_generated_commands_compute_nv.deviceGeneratedCompute == VK_FALSE)
		return false;

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PER_STAGE_BIT_NV) != 0 &&
	    features.per_stage_descriptor_set_nv.perStageDescriptorSet == VK_FALSE)
		return false;

	struct DescriptorCounts
	{
		uint32_t sampled_image;
		uint32_t storage_image;
		uint32_t ssbo;
		uint32_t ubo;
		uint32_t input_attachment;
		uint32_t sampler;
		uint32_t ubo_dynamic;
		uint32_t ssbo_dynamic;
		uint32_t acceleration_structure;
	};
	DescriptorCounts counts = {};
	uint32_t total_count = 0;

	auto *flags = find_pnext<VkDescriptorSetLayoutBindingFlagsCreateInfo>(
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO,
			info->pNext);

	auto *mutable_info = find_pnext<VkMutableDescriptorTypeCreateInfoEXT>(
			VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT,
			info->pNext);

	bool pool_is_update_after_bind = (info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT) != 0;

	for (unsigned i = 0; i < info->bindingCount; i++)
	{
		if (!shader_stage_mask_is_supported(info->pBindings[i].stageFlags))
			return false;

		constexpr VkDescriptorBindingFlags supported_binding_flags =
				VK_DESCRIPTOR_BINDING_UPDATE_AFTER_BIND_BIT |
				VK_DESCRIPTOR_BINDING_UPDATE_UNUSED_WHILE_PENDING_BIT |
				VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT |
				VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT;

		if (flags && (flags->pBindingFlags[i] & ~supported_binding_flags) != 0)
			return false;

		bool binding_is_update_after_bind =
				flags && i < flags->bindingCount &&
				(flags->pBindingFlags[i] & VK_DESCRIPTOR_BINDING_UPDATE_AFTER_BIND_BIT) != 0;

		uint32_t *count = nullptr;

		switch (info->pBindings[i].descriptorType)
		{
		case VK_DESCRIPTOR_TYPE_INLINE_UNIFORM_BLOCK_EXT:
			if (features.inline_uniform_block.inlineUniformBlock == VK_FALSE)
				return false;
			// TODO: maxInlineUniformTotalSize, but this shouldn't matter when we use the EXT.
			if (info->pBindings[i].descriptorCount > props.inline_uniform_block.maxInlineUniformBlockSize)
				return false;
			if (binding_is_update_after_bind && features.inline_uniform_block.descriptorBindingInlineUniformBlockUpdateAfterBind == VK_FALSE)
				return false;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.ssbo;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.ubo;
			break;

		case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
		case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampled_image;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampled_image;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.storage_image;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.storage_image;
			break;

		case VK_DESCRIPTOR_TYPE_SAMPLER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampler;
			break;

		case VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.input_attachment;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.ubo_dynamic;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.ssbo_dynamic;
			break;

		case VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR:
			if (binding_is_update_after_bind &&
			    features.acceleration_structure.descriptorBindingAccelerationStructureUpdateAfterBind == VK_FALSE)
				return false;
			if (features.acceleration_structure.accelerationStructure == VK_FALSE)
				return false;
			count = &counts.acceleration_structure;
			break;

		case VK_DESCRIPTOR_TYPE_MUTABLE_EXT:
		{
			DescriptorCounts mutable_counts = {};
			if (features.mutable_descriptor_type.mutableDescriptorType == VK_FALSE)
				return false;
			if (!mutable_info || i >= mutable_info->mutableDescriptorTypeListCount)
				return false;

			auto &list = mutable_info->pMutableDescriptorTypeLists[i];

			for (uint32_t j = 0; j < list.descriptorTypeCount; j++)
			{
				switch (list.pDescriptorTypes[j])
				{
				case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.ssbo = 1;
					break;

				case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.ubo = 1;
					break;

				case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.sampled_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.sampled_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.storage_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.storage_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_SAMPLER:
					// Sampler is a non-standard type for mutable
					mutable_counts.sampled_image = 1;
					must_check_set_layout_before_accept = true;
					break;

				default:
					return false;
				}
			}

			counts.sampled_image += info->pBindings[i].descriptorCount * mutable_counts.sampled_image;
			counts.storage_image += info->pBindings[i].descriptorCount * mutable_counts.storage_image;
			counts.ubo += info->pBindings[i].descriptorCount * mutable_counts.ubo;
			counts.ssbo += info->pBindings[i].descriptorCount * mutable_counts.ssbo;
			break;
		}

		case VK_DESCRIPTOR_TYPE_BLOCK_MATCH_IMAGE_QCOM:
		case VK_DESCRIPTOR_TYPE_SAMPLE_WEIGHT_IMAGE_QCOM:
			if (enabled_extensions.count(VK_QCOM_IMAGE_PROCESSING_EXTENSION_NAME) == 0)
				return false;
			// *shrug*
			count = nullptr;
			break;

		default:
			return false;
		}

		if (count)
			*count += info->pBindings[i].descriptorCount;
		total_count += info->pBindings[i].descriptorCount;
	}

	if (pool_is_update_after_bind)
	{
		if (features.maintenance7.maintenance7)
		{
			if (counts.ubo_dynamic > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic)
				return false;
			if ((counts.ubo_dynamic + counts.ssbo_dynamic) > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic)
				return false;
		}
		else
		{
			if (counts.ubo_dynamic > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic)
				return false;
		}
		if (counts.ubo > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers)
			return false;
		if (counts.ssbo > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers)
			return false;
		if (counts.sampled_image > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages)
			return false;
		if (counts.storage_image > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers)
			return false;
		if (counts.sampler > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers)
			return false;
		if (counts.input_attachment > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments)
			return false;
		if (counts.acceleration_structure > props.acceleration_structure.maxDescriptorSetUpdateAfterBindAccelerationStructures)
			return false;
	}
	else
	{
		if (features.maintenance7.maintenance7)
		{
			if (counts.ubo_dynamic > props.maintenance7.maxDescriptorSetTotalUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.maintenance7.maxDescriptorSetTotalStorageBuffersDynamic)
				return false;
			if ((counts.ubo_dynamic + counts.ssbo_dynamic) > props.maintenance7.maxDescriptorSetTotalBuffersDynamic)
				return false;
		}
		else
		{
			if (counts.ubo_dynamic > props2.properties.limits.maxDescriptorSetUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props2.properties.limits.maxDescriptorSetStorageBuffersDynamic)
				return false;
		}
		if (counts.ubo > props2.properties.limits.maxDescriptorSetUniformBuffers)
			return false;
		if (counts.ssbo > props2.properties.limits.maxDescriptorSetStorageBuffers)
			return false;
		if (counts.sampled_image > props2.properties.limits.maxDescriptorSetSampledImages)
			return false;
		if (counts.storage_image > props2.properties.limits.maxDescriptorSetStorageImages)
			return false;
		if (counts.sampler > props2.properties.limits.maxDescriptorSetSamplers)
			return false;
		if (counts.input_attachment > props2.properties.limits.maxDescriptorSetInputAttachments)
			return false;
		if (counts.acceleration_structure > props.acceleration_structure.maxDescriptorSetAccelerationStructures)
			return false;
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR) != 0 &&
	    total_count > props.push_descriptor.maxPushDescriptors)
	{
		return false;
	}

	if (must_check_set_layout_before_accept)
	{
		if (query && !query->descriptor_set_layout_is_supported(info))
			return false;
	}

	return pnext_chain_is_supported(info->pNext);
}